

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *iEnd;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  ZSTD_matchState_t *pZVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  ulong *mEnd;
  BYTE *pBVar9;
  U32 *pUVar10;
  undefined8 uVar11;
  bool bVar12;
  char cVar13;
  char cVar14;
  uint uVar15;
  size_t sVar16;
  seqDef **ppsVar17;
  seqDef *psVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  ulong *puVar22;
  BYTE *pBVar23;
  ulong *puVar24;
  ulong *puVar25;
  long lVar26;
  ulong *puVar27;
  ulong *puVar28;
  BYTE *litEnd;
  ulong *puVar29;
  ulong *puVar30;
  BYTE *iStart;
  uint uVar31;
  int iVar32;
  uint uVar33;
  int *piVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  BYTE *pBVar39;
  ulong uVar40;
  ulong uVar41;
  uint uVar42;
  BYTE *pBVar43;
  BYTE *litEnd_3;
  U32 UVar44;
  uint uVar45;
  int iVar46;
  ulong uVar47;
  ulong uVar48;
  BYTE *iend;
  BYTE *ilimit;
  U32 prefixStartIndex;
  BYTE *base;
  U32 hlog;
  BYTE *litLimit_w;
  BYTE *prefixStart;
  BYTE *litLimit_w_4;
  U32 dictIndexDelta;
  BYTE *dictBase;
  BYTE *dictEnd;
  U32 *hashTable;
  U32 dictStartIndex;
  BYTE *dictStart;
  U32 *dictHashTable;
  uint local_12c;
  int local_a0;
  int local_98;
  ulong uVar34;
  
  pZVar6 = ms->dictMatchState;
  if (pZVar6 == (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3e4d,
                  "size_t ZSTD_compressBlock_fast_dictMatchState(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar21 = (ms->cParams).minMatch;
  pUVar7 = ms->hashTable;
  uVar15 = (ms->cParams).targetLength;
  uVar15 = uVar15 + (uVar15 == 0);
  pBVar8 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  iStart = pBVar8 + uVar4;
  iEnd = (ulong *)((long)src + srcSize);
  puVar22 = (ulong *)((long)src + (srcSize - 8));
  uVar5 = (pZVar6->window).dictLimit;
  mEnd = (ulong *)(pZVar6->window).nextSrc;
  pBVar9 = (pZVar6->window).base;
  pBVar23 = pBVar9 + uVar5;
  uVar36 = (int)mEnd - (int)pBVar9;
  uVar31 = uVar4 - uVar36;
  uVar34 = (ulong)uVar31;
  iVar32 = ((int)src - (int)iStart) + (int)mEnd;
  iVar20 = (int)pBVar23;
  uVar33 = iVar32 - iVar20;
  uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  pUVar10 = pZVar6->hashTable;
  iVar46 = (int)pBVar8;
  uVar42 = ((int)iEnd - iVar46) - uVar4;
  local_12c = *rep;
  uVar45 = rep[1];
  cVar13 = (char)(ms->cParams).hashLog;
  cVar14 = (char)(pZVar6->cParams).hashLog;
  puVar25 = (ulong *)src;
  if (uVar21 == 5) {
    if (uVar38 < uVar42) goto LAB_0013f2d8;
    if (uVar4 < uVar36) goto LAB_0013f2f7;
    if (uVar33 < local_12c) goto LAB_0013f316;
    puVar29 = (ulong *)((long)src + (ulong)(iVar32 == iVar20));
    if (uVar33 < uVar45) goto LAB_0013f335;
    if (puVar29 < puVar22) {
      bVar19 = 0x40 - cVar13;
      puVar1 = iEnd + -4;
      ppsVar17 = &seqStore->sequences;
      pBVar43 = iStart;
      do {
        uVar48 = *puVar29;
        uVar37 = uVar48 * -0x30e4432345000000 >> (bVar19 & 0x3f);
        uVar47 = (long)puVar29 - (long)pBVar8;
        UVar44 = (U32)uVar47;
        uVar21 = (UVar44 - local_12c) + 1;
        piVar35 = (int *)(pBVar8 + uVar21);
        if (uVar21 < uVar4) {
          piVar35 = (int *)(pBVar9 + (uVar21 - uVar31));
        }
        uVar33 = pUVar7[uVar37];
        pUVar7[uVar37] = UVar44;
        if (((uVar4 - 1) - uVar21 < 3) || (*piVar35 != *(int *)((long)puVar29 + 1))) {
          if (uVar4 < uVar33) {
            piVar35 = (int *)(pBVar8 + uVar33);
            if (*piVar35 == (int)*puVar29) {
              puVar30 = (ulong *)((long)puVar29 + 4);
              puVar24 = (ulong *)(piVar35 + 1);
              puVar27 = puVar30;
              if (puVar30 < (ulong *)((long)iEnd - 7U)) {
                uVar37 = *puVar30 ^ *puVar24;
                uVar48 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                  }
                }
                pBVar43 = (BYTE *)(uVar48 >> 3 & 0x1fffffff);
                if (*puVar24 == *puVar30) {
                  puVar27 = (ulong *)((long)puVar29 + 0xc);
                  puVar24 = (ulong *)(piVar35 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar27) goto LAB_0013e0f1;
                    uVar48 = *puVar24;
                    uVar37 = *puVar27;
                    uVar40 = uVar37 ^ uVar48;
                    uVar41 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                      }
                    }
                    pBVar43 = (BYTE *)((long)puVar27 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar30))
                    ;
                    puVar27 = puVar27 + 1;
                    puVar24 = puVar24 + 1;
                  } while (uVar48 == uVar37);
                }
              }
              else {
LAB_0013e0f1:
                if ((puVar27 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar24 = (ulong *)((long)puVar24 + 4);
                }
                if ((puVar27 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar27))
                {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar24 = (ulong *)((long)puVar24 + 2);
                }
                if (puVar27 < iEnd) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar27));
                }
                pBVar43 = (BYTE *)((long)puVar27 - (long)puVar30);
              }
              pBVar43 = pBVar43 + 4;
              puVar30 = puVar29;
              if ((uVar4 < uVar33) && (puVar25 < puVar29)) {
                pBVar39 = pBVar8 + ((ulong)uVar33 - 1);
                do {
                  puVar24 = (ulong *)((long)puVar30 + -1);
                  if ((*(BYTE *)puVar24 != *pBVar39) ||
                     (pBVar43 = pBVar43 + 1, puVar30 = puVar24, pBVar39 <= iStart)) break;
                  pBVar39 = pBVar39 + -1;
                } while (puVar25 < puVar24);
              }
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  uVar48 = (long)puVar30 - (long)puVar25;
                  puVar24 = (ulong *)seqStore->lit;
                  if ((BYTE *)((long)puVar24 + uVar48) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (iEnd < puVar30) goto LAB_0013f1e0;
                    if (puVar1 < puVar30) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar24,(BYTE *)puVar25,(BYTE *)puVar30,(BYTE *)puVar1);
                    }
                    else {
                      uVar37 = puVar25[1];
                      *puVar24 = *puVar25;
                      puVar24[1] = uVar37;
                      if (0x10 < uVar48) {
                        pBVar39 = seqStore->lit;
                        puVar24 = (ulong *)(pBVar39 + 0x10);
                        puVar27 = puVar25 + 2;
                        if (0xffffffffffffffe8 < (ulong)((long)puVar24 + (-8 - (long)puVar27)))
                        goto LAB_0013f27b;
                        if (0xffffffffffffffe0 < (ulong)((long)puVar24 + (-0x10 - (long)puVar27)))
                        goto LAB_0013f29a;
                        uVar37 = puVar25[3];
                        *puVar24 = *puVar27;
                        *(ulong *)(pBVar39 + 0x18) = uVar37;
                        if (0x20 < (long)uVar48) {
                          lVar26 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                            uVar11 = puVar3[1];
                            pBVar2 = pBVar39 + lVar26 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar11;
                            puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                            uVar11 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar11;
                            lVar26 = lVar26 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar39 + uVar48);
                        }
                      }
                    }
                    seqStore->lit = seqStore->lit + uVar48;
                    if (0xffff < uVar48) {
                      if (seqStore->longLengthID != 0) goto LAB_0013f25c;
                      seqStore->longLengthID = 1;
                      seqStore->longLengthPos =
                           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                                >> 3);
                    }
                    local_a0 = (int)piVar35;
                    uVar21 = (int)puVar29 - local_a0;
                    pBVar39 = pBVar43 + -3;
                    psVar18 = *ppsVar17;
                    psVar18->litLength = (U16)uVar48;
                    psVar18->offset = uVar21 + 3;
                    puVar29 = puVar30;
                    uVar45 = local_12c;
                    if (pBVar39 < (BYTE *)0x10000) goto LAB_0013e31c;
                    if (seqStore->longLengthID == 0) goto LAB_0013e2f9;
                    goto LAB_0013f21e;
                  }
                  goto LAB_0013f1c1;
                }
                goto LAB_0013f1ff;
              }
              goto LAB_0013f1a2;
            }
            puVar29 = (ulong *)((long)puVar29 + ((long)puVar29 - (long)puVar25 >> 8) + (ulong)uVar15
                               );
          }
          else {
            uVar21 = pUVar10[uVar48 * -0x30e4432345000000 >> (0x40U - cVar14 & 0x3f)];
            if ((uVar5 < uVar21) && (*(int *)(pBVar9 + uVar21) == (int)*puVar29)) {
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar29 + 4),(BYTE *)((long)(pBVar9 + uVar21) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              pBVar43 = (BYTE *)(sVar16 + 4);
              if ((uVar5 < uVar21) && (puVar25 < puVar29)) {
                pBVar39 = pBVar9 + ((ulong)uVar21 - 1);
                do {
                  puVar30 = (ulong *)((long)puVar29 + -1);
                  if ((*(BYTE *)puVar30 != *pBVar39) ||
                     (pBVar43 = pBVar43 + 1, puVar29 = puVar30, pBVar39 <= pBVar23)) break;
                  pBVar39 = pBVar39 + -1;
                } while (puVar25 < puVar30);
              }
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_0013f1a2;
              if (0x20000 < seqStore->maxNbLit) goto LAB_0013f1ff;
              uVar48 = (long)puVar29 - (long)puVar25;
              puVar30 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar30 + uVar48))
              goto LAB_0013f1c1;
              if (iEnd < puVar29) goto LAB_0013f1e0;
              if (puVar1 < puVar29) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar30,(BYTE *)puVar25,(BYTE *)puVar29,(BYTE *)puVar1);
              }
              else {
                uVar37 = puVar25[1];
                *puVar30 = *puVar25;
                puVar30[1] = uVar37;
                if (0x10 < uVar48) {
                  pBVar39 = seqStore->lit;
                  puVar30 = (ulong *)(pBVar39 + 0x10);
                  puVar24 = puVar25 + 2;
                  if (0xffffffffffffffe8 < (ulong)((long)puVar30 + (-8 - (long)puVar24)))
                  goto LAB_0013f27b;
                  if (0xffffffffffffffe0 < (ulong)((long)puVar30 + (-0x10 - (long)puVar24)))
                  goto LAB_0013f29a;
                  uVar37 = puVar25[3];
                  *puVar30 = *puVar24;
                  *(ulong *)(pBVar39 + 0x18) = uVar37;
                  if (0x20 < (long)uVar48) {
                    lVar26 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                      uVar11 = puVar3[1];
                      pBVar2 = pBVar39 + lVar26 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar11;
                      puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                      uVar11 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar11;
                      lVar26 = lVar26 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar39 + uVar48);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar48;
              if (0xffff < uVar48) {
                if (seqStore->longLengthID != 0) goto LAB_0013f25c;
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              uVar21 = UVar44 - (uVar31 + uVar21);
              psVar18 = seqStore->sequences;
              psVar18->litLength = (U16)uVar48;
              psVar18->offset = uVar21 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                if (seqStore->longLengthID != 0) goto LAB_0013f21e;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar18->matchLength = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar18 + 1;
              bVar12 = true;
              uVar45 = local_12c;
              local_12c = uVar21;
            }
            else {
              puVar29 = (ulong *)((long)puVar29 +
                                 ((long)puVar29 - (long)puVar25 >> 8) + (ulong)uVar15);
              bVar12 = false;
            }
            if (bVar12) goto LAB_0013e4f1;
          }
        }
        else {
          puVar30 = iEnd;
          if (uVar21 < uVar4) {
            puVar30 = mEnd;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar29 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar30,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0013f1a2;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0013f1ff;
          puVar30 = (ulong *)((long)puVar29 + 1);
          uVar48 = (long)puVar30 - (long)puVar25;
          puVar29 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar48))
          goto LAB_0013f1c1;
          if (iEnd < puVar30) goto LAB_0013f1e0;
          if (puVar1 < puVar30) {
            ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)puVar25,(BYTE *)puVar30,(BYTE *)puVar1);
          }
          else {
            uVar37 = puVar25[1];
            *puVar29 = *puVar25;
            puVar29[1] = uVar37;
            if (0x10 < uVar48) {
              pBVar43 = seqStore->lit;
              puVar29 = (ulong *)(pBVar43 + 0x10);
              puVar24 = puVar25 + 2;
              if (0xffffffffffffffe8 < (ulong)((long)puVar29 + (-8 - (long)puVar24)))
              goto LAB_0013f27b;
              if (0xffffffffffffffe0 < (ulong)((long)puVar29 + (-0x10 - (long)puVar24)))
              goto LAB_0013f29a;
              uVar37 = puVar25[3];
              *puVar29 = *puVar24;
              *(ulong *)(pBVar43 + 0x18) = uVar37;
              if (0x20 < (long)uVar48) {
                lVar26 = 0;
                do {
                  puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                  uVar11 = puVar3[1];
                  pBVar39 = pBVar43 + lVar26 + 0x20;
                  *(undefined8 *)pBVar39 = *puVar3;
                  *(undefined8 *)(pBVar39 + 8) = uVar11;
                  puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                  uVar11 = puVar3[1];
                  *(undefined8 *)(pBVar39 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar39 + 0x18) = uVar11;
                  lVar26 = lVar26 + 0x20;
                } while (pBVar39 + 0x20 < pBVar43 + uVar48);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar48;
          if (0xffff < uVar48) {
            if (seqStore->longLengthID != 0) goto LAB_0013f25c;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          pBVar43 = (BYTE *)(sVar16 + 4);
          pBVar39 = (BYTE *)(sVar16 + 1);
          psVar18 = *ppsVar17;
          psVar18->litLength = (U16)uVar48;
          psVar18->offset = 1;
          puVar29 = puVar30;
          uVar21 = local_12c;
          if ((BYTE *)0xffff < pBVar39) {
            if (seqStore->longLengthID != 0) goto LAB_0013f21e;
LAB_0013e2f9:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            puVar29 = puVar30;
          }
LAB_0013e31c:
          psVar18->matchLength = (U16)pBVar39;
          *ppsVar17 = psVar18 + 1;
          local_12c = uVar21;
LAB_0013e4f1:
          puVar29 = (ulong *)((long)puVar29 + (long)pBVar43);
          puVar25 = puVar29;
          if (puVar29 <= puVar22) {
            if (pBVar8 + (uVar47 & 0xffffffff) + 2 <= src) goto LAB_0013f23d;
            pUVar7[(ulong)(*(long *)(pBVar8 + (uVar47 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                   (bVar19 & 0x3f)] = UVar44 + 2;
            pUVar7[(ulong)(*(long *)((long)puVar29 + -2) * -0x30e4432345000000) >> (bVar19 & 0x3f)]
                 = ((int)puVar29 + -2) - iVar46;
            do {
              puVar25 = puVar29;
              if (puVar22 < puVar29) break;
              UVar44 = (int)puVar29 - iVar46;
              uVar21 = UVar44 - uVar45;
              pBVar39 = pBVar8;
              if (uVar21 < uVar4) {
                pBVar39 = pBVar9 + -uVar34;
              }
              if (((uVar4 - 1) - uVar21 < 3) || (*(int *)(pBVar39 + uVar21) != (int)*puVar29)) {
                bVar12 = false;
                uVar21 = uVar45;
              }
              else {
                puVar25 = iEnd;
                if (uVar21 < uVar4) {
                  puVar25 = mEnd;
                }
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar29 + 4),
                                    (BYTE *)((long)(pBVar39 + uVar21) + 4),(BYTE *)iEnd,
                                    (BYTE *)puVar25,iStart);
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_0013f1a2;
                if (0x20000 < seqStore->maxNbLit) goto LAB_0013f1ff;
                puVar25 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar25) goto LAB_0013f1c1;
                if (iEnd < puVar29) goto LAB_0013f1e0;
                if (puVar1 < puVar29) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar25,(BYTE *)puVar29,(BYTE *)puVar29,(BYTE *)puVar1);
                }
                else {
                  uVar48 = puVar29[1];
                  *puVar25 = *puVar29;
                  puVar25[1] = uVar48;
                }
                psVar18 = seqStore->sequences;
                psVar18->litLength = 0;
                psVar18->offset = 1;
                if (0xffff < sVar16 + 1) {
                  if (seqStore->longLengthID != 0) goto LAB_0013f21e;
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar18->matchLength = (U16)(sVar16 + 1);
                seqStore->sequences = psVar18 + 1;
                pUVar7[*puVar29 * -0x30e4432345000000 >> (bVar19 & 0x3f)] = UVar44;
                puVar29 = (ulong *)((long)puVar29 + sVar16 + 4);
                bVar12 = true;
                uVar21 = local_12c;
                local_12c = uVar45;
              }
              uVar45 = uVar21;
              puVar25 = puVar29;
            } while (bVar12);
          }
        }
      } while (puVar29 < puVar22);
    }
  }
  else if (uVar21 == 6) {
    if (uVar38 < uVar42) goto LAB_0013f2d8;
    if (uVar4 < uVar36) goto LAB_0013f2f7;
    if (uVar33 < local_12c) goto LAB_0013f316;
    puVar29 = (ulong *)((long)src + (ulong)(iVar32 == iVar20));
    if (uVar33 < uVar45) goto LAB_0013f335;
    if (puVar29 < puVar22) {
      bVar19 = 0x40 - cVar13;
      puVar1 = iEnd + -4;
      ppsVar17 = &seqStore->sequences;
      pBVar43 = iStart;
      do {
        uVar48 = *puVar29;
        uVar37 = uVar48 * -0x30e4432340650000 >> (bVar19 & 0x3f);
        uVar47 = (long)puVar29 - (long)pBVar8;
        UVar44 = (U32)uVar47;
        uVar21 = (UVar44 - local_12c) + 1;
        piVar35 = (int *)(pBVar8 + uVar21);
        if (uVar21 < uVar4) {
          piVar35 = (int *)(pBVar9 + (uVar21 - uVar31));
        }
        uVar33 = pUVar7[uVar37];
        pUVar7[uVar37] = UVar44;
        if (((uVar4 - 1) - uVar21 < 3) || (*piVar35 != *(int *)((long)puVar29 + 1))) {
          if (uVar4 < uVar33) {
            piVar35 = (int *)(pBVar8 + uVar33);
            if (*piVar35 == (int)*puVar29) {
              puVar30 = (ulong *)((long)puVar29 + 4);
              puVar24 = (ulong *)(piVar35 + 1);
              puVar27 = puVar30;
              if (puVar30 < (ulong *)((long)iEnd - 7U)) {
                uVar37 = *puVar30 ^ *puVar24;
                uVar48 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                  }
                }
                pBVar43 = (BYTE *)(uVar48 >> 3 & 0x1fffffff);
                if (*puVar24 == *puVar30) {
                  puVar27 = (ulong *)((long)puVar29 + 0xc);
                  puVar24 = (ulong *)(piVar35 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar27) goto LAB_0013d641;
                    uVar48 = *puVar24;
                    uVar37 = *puVar27;
                    uVar40 = uVar37 ^ uVar48;
                    uVar41 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                      }
                    }
                    pBVar43 = (BYTE *)((long)puVar27 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar30))
                    ;
                    puVar27 = puVar27 + 1;
                    puVar24 = puVar24 + 1;
                  } while (uVar48 == uVar37);
                }
              }
              else {
LAB_0013d641:
                if ((puVar27 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar24 = (ulong *)((long)puVar24 + 4);
                }
                if ((puVar27 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar27))
                {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar24 = (ulong *)((long)puVar24 + 2);
                }
                if (puVar27 < iEnd) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar27));
                }
                pBVar43 = (BYTE *)((long)puVar27 - (long)puVar30);
              }
              pBVar43 = pBVar43 + 4;
              puVar30 = puVar29;
              if ((uVar4 < uVar33) && (puVar25 < puVar29)) {
                pBVar39 = pBVar8 + ((ulong)uVar33 - 1);
                do {
                  puVar24 = (ulong *)((long)puVar30 + -1);
                  if ((*(BYTE *)puVar24 != *pBVar39) ||
                     (pBVar43 = pBVar43 + 1, puVar30 = puVar24, pBVar39 <= iStart)) break;
                  pBVar39 = pBVar39 + -1;
                } while (puVar25 < puVar24);
              }
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  uVar48 = (long)puVar30 - (long)puVar25;
                  puVar24 = (ulong *)seqStore->lit;
                  if ((BYTE *)((long)puVar24 + uVar48) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (iEnd < puVar30) goto LAB_0013f1e0;
                    if (puVar1 < puVar30) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar24,(BYTE *)puVar25,(BYTE *)puVar30,(BYTE *)puVar1);
                    }
                    else {
                      uVar37 = puVar25[1];
                      *puVar24 = *puVar25;
                      puVar24[1] = uVar37;
                      if (0x10 < uVar48) {
                        pBVar39 = seqStore->lit;
                        puVar24 = (ulong *)(pBVar39 + 0x10);
                        puVar27 = puVar25 + 2;
                        if (0xffffffffffffffe8 < (ulong)((long)puVar24 + (-8 - (long)puVar27)))
                        goto LAB_0013f27b;
                        if (0xffffffffffffffe0 < (ulong)((long)puVar24 + (-0x10 - (long)puVar27)))
                        goto LAB_0013f29a;
                        uVar37 = puVar25[3];
                        *puVar24 = *puVar27;
                        *(ulong *)(pBVar39 + 0x18) = uVar37;
                        if (0x20 < (long)uVar48) {
                          lVar26 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                            uVar11 = puVar3[1];
                            pBVar2 = pBVar39 + lVar26 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar11;
                            puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                            uVar11 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar11;
                            lVar26 = lVar26 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar39 + uVar48);
                        }
                      }
                    }
                    seqStore->lit = seqStore->lit + uVar48;
                    if (0xffff < uVar48) {
                      if (seqStore->longLengthID != 0) goto LAB_0013f25c;
                      seqStore->longLengthID = 1;
                      seqStore->longLengthPos =
                           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                                >> 3);
                    }
                    local_98 = (int)piVar35;
                    uVar21 = (int)puVar29 - local_98;
                    pBVar39 = pBVar43 + -3;
                    psVar18 = *ppsVar17;
                    psVar18->litLength = (U16)uVar48;
                    psVar18->offset = uVar21 + 3;
                    puVar29 = puVar30;
                    uVar45 = local_12c;
                    if (pBVar39 < (BYTE *)0x10000) goto LAB_0013d86c;
                    if (seqStore->longLengthID == 0) goto LAB_0013d849;
                    goto LAB_0013f21e;
                  }
                  goto LAB_0013f1c1;
                }
                goto LAB_0013f1ff;
              }
              goto LAB_0013f1a2;
            }
            puVar29 = (ulong *)((long)puVar29 + ((long)puVar29 - (long)puVar25 >> 8) + (ulong)uVar15
                               );
          }
          else {
            uVar21 = pUVar10[uVar48 * -0x30e4432340650000 >> (0x40U - cVar14 & 0x3f)];
            if ((uVar5 < uVar21) && (*(int *)(pBVar9 + uVar21) == (int)*puVar29)) {
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar29 + 4),(BYTE *)((long)(pBVar9 + uVar21) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              pBVar43 = (BYTE *)(sVar16 + 4);
              if ((uVar5 < uVar21) && (puVar25 < puVar29)) {
                pBVar39 = pBVar9 + ((ulong)uVar21 - 1);
                do {
                  puVar30 = (ulong *)((long)puVar29 + -1);
                  if ((*(BYTE *)puVar30 != *pBVar39) ||
                     (pBVar43 = pBVar43 + 1, puVar29 = puVar30, pBVar39 <= pBVar23)) break;
                  pBVar39 = pBVar39 + -1;
                } while (puVar25 < puVar30);
              }
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_0013f1a2;
              if (0x20000 < seqStore->maxNbLit) goto LAB_0013f1ff;
              uVar48 = (long)puVar29 - (long)puVar25;
              puVar30 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar30 + uVar48))
              goto LAB_0013f1c1;
              if (iEnd < puVar29) goto LAB_0013f1e0;
              if (puVar1 < puVar29) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar30,(BYTE *)puVar25,(BYTE *)puVar29,(BYTE *)puVar1);
              }
              else {
                uVar37 = puVar25[1];
                *puVar30 = *puVar25;
                puVar30[1] = uVar37;
                if (0x10 < uVar48) {
                  pBVar39 = seqStore->lit;
                  puVar30 = (ulong *)(pBVar39 + 0x10);
                  puVar24 = puVar25 + 2;
                  if (0xffffffffffffffe8 < (ulong)((long)puVar30 + (-8 - (long)puVar24)))
                  goto LAB_0013f27b;
                  if (0xffffffffffffffe0 < (ulong)((long)puVar30 + (-0x10 - (long)puVar24)))
                  goto LAB_0013f29a;
                  uVar37 = puVar25[3];
                  *puVar30 = *puVar24;
                  *(ulong *)(pBVar39 + 0x18) = uVar37;
                  if (0x20 < (long)uVar48) {
                    lVar26 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                      uVar11 = puVar3[1];
                      pBVar2 = pBVar39 + lVar26 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar11;
                      puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                      uVar11 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar11;
                      lVar26 = lVar26 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar39 + uVar48);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar48;
              if (0xffff < uVar48) {
                if (seqStore->longLengthID != 0) goto LAB_0013f25c;
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              uVar21 = UVar44 - (uVar31 + uVar21);
              psVar18 = seqStore->sequences;
              psVar18->litLength = (U16)uVar48;
              psVar18->offset = uVar21 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                if (seqStore->longLengthID != 0) goto LAB_0013f21e;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar18->matchLength = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar18 + 1;
              bVar12 = true;
              uVar45 = local_12c;
              local_12c = uVar21;
            }
            else {
              puVar29 = (ulong *)((long)puVar29 +
                                 ((long)puVar29 - (long)puVar25 >> 8) + (ulong)uVar15);
              bVar12 = false;
            }
            if (bVar12) goto LAB_0013da3e;
          }
        }
        else {
          puVar30 = iEnd;
          if (uVar21 < uVar4) {
            puVar30 = mEnd;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar29 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar30,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0013f1a2;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0013f1ff;
          puVar30 = (ulong *)((long)puVar29 + 1);
          uVar48 = (long)puVar30 - (long)puVar25;
          puVar29 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar48))
          goto LAB_0013f1c1;
          if (iEnd < puVar30) goto LAB_0013f1e0;
          if (puVar1 < puVar30) {
            ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)puVar25,(BYTE *)puVar30,(BYTE *)puVar1);
          }
          else {
            uVar37 = puVar25[1];
            *puVar29 = *puVar25;
            puVar29[1] = uVar37;
            if (0x10 < uVar48) {
              pBVar43 = seqStore->lit;
              puVar29 = (ulong *)(pBVar43 + 0x10);
              puVar24 = puVar25 + 2;
              if (0xffffffffffffffe8 < (ulong)((long)puVar29 + (-8 - (long)puVar24)))
              goto LAB_0013f27b;
              if (0xffffffffffffffe0 < (ulong)((long)puVar29 + (-0x10 - (long)puVar24)))
              goto LAB_0013f29a;
              uVar37 = puVar25[3];
              *puVar29 = *puVar24;
              *(ulong *)(pBVar43 + 0x18) = uVar37;
              if (0x20 < (long)uVar48) {
                lVar26 = 0;
                do {
                  puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                  uVar11 = puVar3[1];
                  pBVar39 = pBVar43 + lVar26 + 0x20;
                  *(undefined8 *)pBVar39 = *puVar3;
                  *(undefined8 *)(pBVar39 + 8) = uVar11;
                  puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                  uVar11 = puVar3[1];
                  *(undefined8 *)(pBVar39 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar39 + 0x18) = uVar11;
                  lVar26 = lVar26 + 0x20;
                } while (pBVar39 + 0x20 < pBVar43 + uVar48);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar48;
          if (0xffff < uVar48) {
            if (seqStore->longLengthID != 0) goto LAB_0013f25c;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          pBVar43 = (BYTE *)(sVar16 + 4);
          pBVar39 = (BYTE *)(sVar16 + 1);
          psVar18 = *ppsVar17;
          psVar18->litLength = (U16)uVar48;
          psVar18->offset = 1;
          puVar29 = puVar30;
          uVar21 = local_12c;
          if ((BYTE *)0xffff < pBVar39) {
            if (seqStore->longLengthID != 0) goto LAB_0013f21e;
LAB_0013d849:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            puVar29 = puVar30;
          }
LAB_0013d86c:
          psVar18->matchLength = (U16)pBVar39;
          *ppsVar17 = psVar18 + 1;
          local_12c = uVar21;
LAB_0013da3e:
          puVar29 = (ulong *)((long)puVar29 + (long)pBVar43);
          puVar25 = puVar29;
          if (puVar29 <= puVar22) {
            if (pBVar8 + (uVar47 & 0xffffffff) + 2 <= src) goto LAB_0013f23d;
            pUVar7[(ulong)(*(long *)(pBVar8 + (uVar47 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                   (bVar19 & 0x3f)] = UVar44 + 2;
            pUVar7[(ulong)(*(long *)((long)puVar29 + -2) * -0x30e4432340650000) >> (bVar19 & 0x3f)]
                 = ((int)puVar29 + -2) - iVar46;
            do {
              puVar25 = puVar29;
              if (puVar22 < puVar29) break;
              UVar44 = (int)puVar29 - iVar46;
              uVar21 = UVar44 - uVar45;
              pBVar39 = pBVar8;
              if (uVar21 < uVar4) {
                pBVar39 = pBVar9 + -uVar34;
              }
              if (((uVar4 - 1) - uVar21 < 3) || (*(int *)(pBVar39 + uVar21) != (int)*puVar29)) {
                bVar12 = false;
                uVar21 = uVar45;
              }
              else {
                puVar25 = iEnd;
                if (uVar21 < uVar4) {
                  puVar25 = mEnd;
                }
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar29 + 4),
                                    (BYTE *)((long)(pBVar39 + uVar21) + 4),(BYTE *)iEnd,
                                    (BYTE *)puVar25,iStart);
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_0013f1a2;
                if (0x20000 < seqStore->maxNbLit) goto LAB_0013f1ff;
                puVar25 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar25) goto LAB_0013f1c1;
                if (iEnd < puVar29) goto LAB_0013f1e0;
                if (puVar1 < puVar29) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar25,(BYTE *)puVar29,(BYTE *)puVar29,(BYTE *)puVar1);
                }
                else {
                  uVar48 = puVar29[1];
                  *puVar25 = *puVar29;
                  puVar25[1] = uVar48;
                }
                psVar18 = seqStore->sequences;
                psVar18->litLength = 0;
                psVar18->offset = 1;
                if (0xffff < sVar16 + 1) {
                  if (seqStore->longLengthID != 0) goto LAB_0013f21e;
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar18->matchLength = (U16)(sVar16 + 1);
                seqStore->sequences = psVar18 + 1;
                pUVar7[*puVar29 * -0x30e4432340650000 >> (bVar19 & 0x3f)] = UVar44;
                puVar29 = (ulong *)((long)puVar29 + sVar16 + 4);
                bVar12 = true;
                uVar21 = local_12c;
                local_12c = uVar45;
              }
              uVar45 = uVar21;
              puVar25 = puVar29;
            } while (bVar12);
          }
        }
      } while (puVar29 < puVar22);
    }
  }
  else if (uVar21 == 7) {
    if (uVar38 < uVar42) {
LAB_0013f2d8:
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3dd8,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (uVar4 < uVar36) {
LAB_0013f2f7:
      __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3ddd,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (uVar33 < local_12c) {
LAB_0013f316:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de4,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    puVar29 = (ulong *)((long)src + (ulong)(iVar32 == iVar20));
    if (uVar33 < uVar45) {
LAB_0013f335:
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de5,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (puVar29 < puVar22) {
      bVar19 = 0x40 - cVar13;
      puVar1 = iEnd + -4;
      ppsVar17 = &seqStore->sequences;
      pBVar43 = iStart;
      do {
        uVar48 = *puVar29;
        uVar37 = uVar48 * -0x30e44323405a9d00 >> (bVar19 & 0x3f);
        uVar47 = (long)puVar29 - (long)pBVar8;
        UVar44 = (U32)uVar47;
        uVar21 = (UVar44 - local_12c) + 1;
        piVar35 = (int *)(pBVar8 + uVar21);
        if (uVar21 < uVar4) {
          piVar35 = (int *)(pBVar9 + (uVar21 - uVar31));
        }
        uVar33 = pUVar7[uVar37];
        pUVar7[uVar37] = UVar44;
        if (((uVar4 - 1) - uVar21 < 3) || (*piVar35 != *(int *)((long)puVar29 + 1))) {
          if (uVar4 < uVar33) {
            piVar35 = (int *)(pBVar8 + uVar33);
            if (*piVar35 == (int)*puVar29) {
              puVar30 = (ulong *)((long)puVar29 + 4);
              puVar24 = (ulong *)(piVar35 + 1);
              puVar27 = puVar30;
              if (puVar30 < (ulong *)((long)iEnd - 7U)) {
                uVar37 = *puVar30 ^ *puVar24;
                uVar48 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                  }
                }
                pBVar43 = (BYTE *)(uVar48 >> 3 & 0x1fffffff);
                if (*puVar24 == *puVar30) {
                  puVar27 = (ulong *)((long)puVar29 + 0xc);
                  puVar24 = (ulong *)(piVar35 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar27) goto LAB_0013cb7d;
                    uVar48 = *puVar24;
                    uVar37 = *puVar27;
                    uVar40 = uVar37 ^ uVar48;
                    uVar41 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                      }
                    }
                    pBVar43 = (BYTE *)((long)puVar27 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar30))
                    ;
                    puVar27 = puVar27 + 1;
                    puVar24 = puVar24 + 1;
                  } while (uVar48 == uVar37);
                }
              }
              else {
LAB_0013cb7d:
                if ((puVar27 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar24 = (ulong *)((long)puVar24 + 4);
                }
                if ((puVar27 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar27))
                {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar24 = (ulong *)((long)puVar24 + 2);
                }
                if (puVar27 < iEnd) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar27));
                }
                pBVar43 = (BYTE *)((long)puVar27 - (long)puVar30);
              }
              pBVar43 = pBVar43 + 4;
              puVar30 = puVar29;
              if ((uVar4 < uVar33) && (puVar25 < puVar29)) {
                pBVar39 = pBVar8 + ((ulong)uVar33 - 1);
                do {
                  puVar24 = (ulong *)((long)puVar30 + -1);
                  if ((*(BYTE *)puVar24 != *pBVar39) ||
                     (pBVar43 = pBVar43 + 1, puVar30 = puVar24, pBVar39 <= iStart)) break;
                  pBVar39 = pBVar39 + -1;
                } while (puVar25 < puVar24);
              }
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  uVar48 = (long)puVar30 - (long)puVar25;
                  puVar24 = (ulong *)seqStore->lit;
                  if ((BYTE *)((long)puVar24 + uVar48) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (iEnd < puVar30) goto LAB_0013f1e0;
                    if (puVar1 < puVar30) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar24,(BYTE *)puVar25,(BYTE *)puVar30,(BYTE *)puVar1);
                    }
                    else {
                      uVar37 = puVar25[1];
                      *puVar24 = *puVar25;
                      puVar24[1] = uVar37;
                      if (0x10 < uVar48) {
                        pBVar39 = seqStore->lit;
                        puVar24 = (ulong *)(pBVar39 + 0x10);
                        puVar27 = puVar25 + 2;
                        if (0xffffffffffffffe8 < (ulong)((long)puVar24 + (-8 - (long)puVar27)))
                        goto LAB_0013f27b;
                        if (0xffffffffffffffe0 < (ulong)((long)puVar24 + (-0x10 - (long)puVar27)))
                        goto LAB_0013f29a;
                        uVar37 = puVar25[3];
                        *puVar24 = *puVar27;
                        *(ulong *)(pBVar39 + 0x18) = uVar37;
                        if (0x20 < (long)uVar48) {
                          lVar26 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                            uVar11 = puVar3[1];
                            pBVar2 = pBVar39 + lVar26 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar11;
                            puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                            uVar11 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar11;
                            lVar26 = lVar26 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar39 + uVar48);
                        }
                      }
                    }
                    seqStore->lit = seqStore->lit + uVar48;
                    if (0xffff < uVar48) {
                      if (seqStore->longLengthID != 0) goto LAB_0013f25c;
                      seqStore->longLengthID = 1;
                      seqStore->longLengthPos =
                           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                                >> 3);
                    }
                    local_98 = (int)piVar35;
                    uVar21 = (int)puVar29 - local_98;
                    pBVar39 = pBVar43 + -3;
                    psVar18 = *ppsVar17;
                    psVar18->litLength = (U16)uVar48;
                    psVar18->offset = uVar21 + 3;
                    puVar29 = puVar30;
                    uVar45 = local_12c;
                    if (pBVar39 < (BYTE *)0x10000) goto LAB_0013cda8;
                    if (seqStore->longLengthID == 0) goto LAB_0013cd85;
LAB_0013f21e:
                    __assert_fail("seqStorePtr->longLengthID == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x2058,
                                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                 );
                  }
                  goto LAB_0013f1c1;
                }
                goto LAB_0013f1ff;
              }
              goto LAB_0013f1a2;
            }
            puVar29 = (ulong *)((long)puVar29 + ((long)puVar29 - (long)puVar25 >> 8) + (ulong)uVar15
                               );
          }
          else {
            uVar21 = pUVar10[uVar48 * -0x30e44323405a9d00 >> (0x40U - cVar14 & 0x3f)];
            if ((uVar5 < uVar21) && (*(int *)(pBVar9 + uVar21) == (int)*puVar29)) {
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar29 + 4),(BYTE *)((long)(pBVar9 + uVar21) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              pBVar43 = (BYTE *)(sVar16 + 4);
              if ((uVar5 < uVar21) && (puVar25 < puVar29)) {
                pBVar39 = pBVar9 + ((ulong)uVar21 - 1);
                do {
                  puVar30 = (ulong *)((long)puVar29 + -1);
                  if ((*(BYTE *)puVar30 != *pBVar39) ||
                     (pBVar43 = pBVar43 + 1, puVar29 = puVar30, pBVar39 <= pBVar23)) break;
                  pBVar39 = pBVar39 + -1;
                } while (puVar25 < puVar30);
              }
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_0013f1a2;
              if (0x20000 < seqStore->maxNbLit) goto LAB_0013f1ff;
              uVar48 = (long)puVar29 - (long)puVar25;
              puVar30 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar30 + uVar48))
              goto LAB_0013f1c1;
              if (iEnd < puVar29) goto LAB_0013f1e0;
              if (puVar1 < puVar29) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar30,(BYTE *)puVar25,(BYTE *)puVar29,(BYTE *)puVar1);
              }
              else {
                uVar37 = puVar25[1];
                *puVar30 = *puVar25;
                puVar30[1] = uVar37;
                if (0x10 < uVar48) {
                  pBVar39 = seqStore->lit;
                  puVar30 = (ulong *)(pBVar39 + 0x10);
                  puVar24 = puVar25 + 2;
                  if (0xffffffffffffffe8 < (ulong)((long)puVar30 + (-8 - (long)puVar24)))
                  goto LAB_0013f27b;
                  if (0xffffffffffffffe0 < (ulong)((long)puVar30 + (-0x10 - (long)puVar24)))
                  goto LAB_0013f29a;
                  uVar37 = puVar25[3];
                  *puVar30 = *puVar24;
                  *(ulong *)(pBVar39 + 0x18) = uVar37;
                  if (0x20 < (long)uVar48) {
                    lVar26 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                      uVar11 = puVar3[1];
                      pBVar2 = pBVar39 + lVar26 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar11;
                      puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                      uVar11 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar11;
                      lVar26 = lVar26 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar39 + uVar48);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar48;
              if (0xffff < uVar48) {
                if (seqStore->longLengthID != 0) goto LAB_0013f25c;
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              uVar21 = UVar44 - (uVar31 + uVar21);
              psVar18 = seqStore->sequences;
              psVar18->litLength = (U16)uVar48;
              psVar18->offset = uVar21 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                if (seqStore->longLengthID != 0) goto LAB_0013f21e;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar18->matchLength = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar18 + 1;
              bVar12 = true;
              uVar45 = local_12c;
              local_12c = uVar21;
            }
            else {
              puVar29 = (ulong *)((long)puVar29 +
                                 ((long)puVar29 - (long)puVar25 >> 8) + (ulong)uVar15);
              bVar12 = false;
            }
            if (bVar12) goto LAB_0013cf7a;
          }
        }
        else {
          puVar30 = iEnd;
          if (uVar21 < uVar4) {
            puVar30 = mEnd;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar29 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar30,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0013f1a2:
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
LAB_0013f1ff:
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          puVar30 = (ulong *)((long)puVar29 + 1);
          uVar48 = (long)puVar30 - (long)puVar25;
          puVar29 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar48)) {
LAB_0013f1c1:
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (iEnd < puVar30) {
LAB_0013f1e0:
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (puVar1 < puVar30) {
            ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)puVar25,(BYTE *)puVar30,(BYTE *)puVar1);
          }
          else {
            uVar37 = puVar25[1];
            *puVar29 = *puVar25;
            puVar29[1] = uVar37;
            if (0x10 < uVar48) {
              pBVar43 = seqStore->lit;
              puVar29 = (ulong *)(pBVar43 + 0x10);
              puVar24 = puVar25 + 2;
              if (0xffffffffffffffe8 < (ulong)((long)puVar29 + (-8 - (long)puVar24))) {
LAB_0013f27b:
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if (0xffffffffffffffe0 < (ulong)((long)puVar29 + (-0x10 - (long)puVar24))) {
LAB_0013f29a:
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              uVar37 = puVar25[3];
              *puVar29 = *puVar24;
              *(ulong *)(pBVar43 + 0x18) = uVar37;
              if (0x20 < (long)uVar48) {
                lVar26 = 0;
                do {
                  puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                  uVar11 = puVar3[1];
                  pBVar39 = pBVar43 + lVar26 + 0x20;
                  *(undefined8 *)pBVar39 = *puVar3;
                  *(undefined8 *)(pBVar39 + 8) = uVar11;
                  puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                  uVar11 = puVar3[1];
                  *(undefined8 *)(pBVar39 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar39 + 0x18) = uVar11;
                  lVar26 = lVar26 + 0x20;
                } while (pBVar39 + 0x20 < pBVar43 + uVar48);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar48;
          if (0xffff < uVar48) {
            if (seqStore->longLengthID != 0) {
LAB_0013f25c:
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          pBVar43 = (BYTE *)(sVar16 + 4);
          pBVar39 = (BYTE *)(sVar16 + 1);
          psVar18 = *ppsVar17;
          psVar18->litLength = (U16)uVar48;
          psVar18->offset = 1;
          puVar29 = puVar30;
          uVar21 = local_12c;
          if ((BYTE *)0xffff < pBVar39) {
            if (seqStore->longLengthID != 0) goto LAB_0013f21e;
LAB_0013cd85:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            puVar29 = puVar30;
          }
LAB_0013cda8:
          psVar18->matchLength = (U16)pBVar39;
          *ppsVar17 = psVar18 + 1;
          local_12c = uVar21;
LAB_0013cf7a:
          puVar29 = (ulong *)((long)puVar29 + (long)pBVar43);
          puVar25 = puVar29;
          if (puVar29 <= puVar22) {
            if (pBVar8 + (uVar47 & 0xffffffff) + 2 <= src) {
LAB_0013f23d:
              __assert_fail("base+current+2 > istart",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3e25,
                            "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            pUVar7[(ulong)(*(long *)(pBVar8 + (uVar47 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                   (bVar19 & 0x3f)] = UVar44 + 2;
            pUVar7[(ulong)(*(long *)((long)puVar29 + -2) * -0x30e44323405a9d00) >> (bVar19 & 0x3f)]
                 = ((int)puVar29 + -2) - iVar46;
            do {
              puVar25 = puVar29;
              if (puVar22 < puVar29) break;
              UVar44 = (int)puVar29 - iVar46;
              uVar21 = UVar44 - uVar45;
              pBVar39 = pBVar8;
              if (uVar21 < uVar4) {
                pBVar39 = pBVar9 + -uVar34;
              }
              if (((uVar4 - 1) - uVar21 < 3) || (*(int *)(pBVar39 + uVar21) != (int)*puVar29)) {
                bVar12 = false;
                uVar21 = uVar45;
              }
              else {
                puVar25 = iEnd;
                if (uVar21 < uVar4) {
                  puVar25 = mEnd;
                }
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar29 + 4),
                                    (BYTE *)((long)(pBVar39 + uVar21) + 4),(BYTE *)iEnd,
                                    (BYTE *)puVar25,iStart);
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_0013f1a2;
                if (0x20000 < seqStore->maxNbLit) goto LAB_0013f1ff;
                puVar25 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar25) goto LAB_0013f1c1;
                if (iEnd < puVar29) goto LAB_0013f1e0;
                if (puVar1 < puVar29) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar25,(BYTE *)puVar29,(BYTE *)puVar29,(BYTE *)puVar1);
                }
                else {
                  uVar48 = puVar29[1];
                  *puVar25 = *puVar29;
                  puVar25[1] = uVar48;
                }
                psVar18 = seqStore->sequences;
                psVar18->litLength = 0;
                psVar18->offset = 1;
                if (0xffff < sVar16 + 1) {
                  if (seqStore->longLengthID != 0) goto LAB_0013f21e;
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar18->matchLength = (U16)(sVar16 + 1);
                seqStore->sequences = psVar18 + 1;
                pUVar7[*puVar29 * -0x30e44323405a9d00 >> (bVar19 & 0x3f)] = UVar44;
                puVar29 = (ulong *)((long)puVar29 + sVar16 + 4);
                bVar12 = true;
                uVar21 = local_12c;
                local_12c = uVar45;
              }
              uVar45 = uVar21;
              puVar25 = puVar29;
            } while (bVar12);
          }
        }
      } while (puVar29 < puVar22);
    }
  }
  else {
    if (uVar38 < uVar42) goto LAB_0013f2d8;
    if (uVar4 < uVar36) goto LAB_0013f2f7;
    if (uVar33 < local_12c) goto LAB_0013f316;
    puVar29 = (ulong *)((long)src + (ulong)(iVar32 == iVar20));
    if (uVar33 < uVar45) goto LAB_0013f335;
    if (puVar29 < puVar22) {
      bVar19 = 0x20 - cVar13;
      puVar1 = iEnd + -4;
      ppsVar17 = &seqStore->sequences;
      pBVar43 = iStart;
      do {
        uVar36 = (uint)((int)*puVar29 * -0x61c8864f) >> (bVar19 & 0x1f);
        uVar21 = pUVar7[uVar36];
        UVar44 = (U32)((long)puVar29 - (long)pBVar8);
        uVar33 = (UVar44 - local_12c) + 1;
        piVar35 = (int *)(pBVar8 + uVar33);
        if (uVar33 < uVar4) {
          piVar35 = (int *)(pBVar9 + (uVar33 - uVar31));
        }
        pUVar7[uVar36] = UVar44;
        if (((uVar4 - 1) - uVar33 < 3) || (*piVar35 != *(int *)((long)puVar29 + 1))) {
          puVar30 = puVar29;
          if (uVar4 < uVar21) {
            piVar35 = (int *)(pBVar8 + uVar21);
            if (*piVar35 == (int)*puVar29) {
              puVar27 = (ulong *)((long)puVar29 + 4);
              puVar24 = (ulong *)(piVar35 + 1);
              puVar28 = puVar27;
              if (puVar27 < (ulong *)((long)iEnd - 7U)) {
                uVar37 = *puVar27 ^ *puVar24;
                uVar48 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                  }
                }
                pBVar43 = (BYTE *)(uVar48 >> 3 & 0x1fffffff);
                if (*puVar24 == *puVar27) {
                  puVar28 = (ulong *)((long)puVar29 + 0xc);
                  puVar24 = (ulong *)(piVar35 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar28) goto LAB_0013eb96;
                    uVar48 = *puVar24;
                    uVar37 = *puVar28;
                    uVar41 = uVar37 ^ uVar48;
                    uVar47 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                      }
                    }
                    pBVar43 = (BYTE *)((long)puVar28 + ((uVar47 >> 3 & 0x1fffffff) - (long)puVar27))
                    ;
                    puVar28 = puVar28 + 1;
                    puVar24 = puVar24 + 1;
                  } while (uVar48 == uVar37);
                }
              }
              else {
LAB_0013eb96:
                if ((puVar28 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar28)) {
                  puVar28 = (ulong *)((long)puVar28 + 4);
                  puVar24 = (ulong *)((long)puVar24 + 4);
                }
                if ((puVar28 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar28))
                {
                  puVar28 = (ulong *)((long)puVar28 + 2);
                  puVar24 = (ulong *)((long)puVar24 + 2);
                }
                if (puVar28 < iEnd) {
                  puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar28));
                }
                pBVar43 = (BYTE *)((long)puVar28 - (long)puVar27);
              }
              pBVar43 = pBVar43 + 4;
              if ((uVar4 < uVar21) && (puVar25 < puVar29)) {
                pBVar39 = pBVar8 + ((ulong)uVar21 - 1);
                do {
                  puVar24 = (ulong *)((long)puVar30 + -1);
                  if ((*(BYTE *)puVar24 != *pBVar39) ||
                     (pBVar43 = pBVar43 + 1, puVar30 = puVar24, pBVar39 <= iStart)) break;
                  pBVar39 = pBVar39 + -1;
                } while (puVar25 < puVar24);
              }
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  uVar48 = (long)puVar30 - (long)puVar25;
                  puVar24 = (ulong *)seqStore->lit;
                  if ((BYTE *)((long)puVar24 + uVar48) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (iEnd < puVar30) goto LAB_0013f1e0;
                    if (puVar1 < puVar30) {
                      ZSTD_safecopyLiterals
                                ((BYTE *)puVar24,(BYTE *)puVar25,(BYTE *)puVar30,(BYTE *)puVar1);
                    }
                    else {
                      uVar37 = puVar25[1];
                      *puVar24 = *puVar25;
                      puVar24[1] = uVar37;
                      if (0x10 < uVar48) {
                        pBVar39 = seqStore->lit;
                        puVar24 = (ulong *)(pBVar39 + 0x10);
                        puVar27 = puVar25 + 2;
                        if (0xffffffffffffffe8 < (ulong)((long)puVar24 + (-8 - (long)puVar27)))
                        goto LAB_0013f27b;
                        if (0xffffffffffffffe0 < (ulong)((long)puVar24 + (-0x10 - (long)puVar27)))
                        goto LAB_0013f29a;
                        uVar37 = puVar25[3];
                        *puVar24 = *puVar27;
                        *(ulong *)(pBVar39 + 0x18) = uVar37;
                        if (0x20 < (long)uVar48) {
                          lVar26 = 0;
                          do {
                            puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                            uVar11 = puVar3[1];
                            pBVar2 = pBVar39 + lVar26 + 0x20;
                            *(undefined8 *)pBVar2 = *puVar3;
                            *(undefined8 *)(pBVar2 + 8) = uVar11;
                            puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                            uVar11 = puVar3[1];
                            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                            *(undefined8 *)(pBVar2 + 0x18) = uVar11;
                            lVar26 = lVar26 + 0x20;
                          } while (pBVar2 + 0x20 < pBVar39 + uVar48);
                        }
                      }
                    }
                    seqStore->lit = seqStore->lit + uVar48;
                    if (0xffff < uVar48) {
                      if (seqStore->longLengthID != 0) goto LAB_0013f25c;
                      seqStore->longLengthID = 1;
                      seqStore->longLengthPos =
                           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                                >> 3);
                    }
                    uVar21 = (int)puVar29 - (int)piVar35;
                    pBVar39 = pBVar43 + -3;
                    psVar18 = *ppsVar17;
                    psVar18->litLength = (U16)uVar48;
                    psVar18->offset = uVar21 + 3;
                    uVar45 = local_12c;
                    if (pBVar39 < (BYTE *)0x10000) goto LAB_0013edc1;
                    if (seqStore->longLengthID == 0) goto LAB_0013eda3;
                    goto LAB_0013f21e;
                  }
                  goto LAB_0013f1c1;
                }
                goto LAB_0013f1ff;
              }
              goto LAB_0013f1a2;
            }
            puVar30 = (ulong *)((long)puVar29 + ((long)puVar29 - (long)puVar25 >> 8) + (ulong)uVar15
                               );
          }
          else {
            uVar21 = pUVar10[(uint)((int)*puVar29 * -0x61c8864f) >> (0x20U - cVar14 & 0x1f)];
            if ((uVar5 < uVar21) && (*(int *)(pBVar9 + uVar21) == (int)*puVar29)) {
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar29 + 4),(BYTE *)((long)(pBVar9 + uVar21) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              pBVar43 = (BYTE *)(sVar16 + 4);
              if ((uVar5 < uVar21) && (puVar25 < puVar29)) {
                pBVar39 = pBVar9 + ((ulong)uVar21 - 1);
                do {
                  puVar24 = (ulong *)((long)puVar30 + -1);
                  if ((*(BYTE *)puVar24 != *pBVar39) ||
                     (pBVar43 = pBVar43 + 1, puVar30 = puVar24, pBVar39 <= pBVar23)) break;
                  pBVar39 = pBVar39 + -1;
                } while (puVar25 < puVar24);
              }
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_0013f1a2;
              if (0x20000 < seqStore->maxNbLit) goto LAB_0013f1ff;
              uVar48 = (long)puVar30 - (long)puVar25;
              puVar24 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar24 + uVar48))
              goto LAB_0013f1c1;
              if (iEnd < puVar30) goto LAB_0013f1e0;
              if (puVar1 < puVar30) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar24,(BYTE *)puVar25,(BYTE *)puVar30,(BYTE *)puVar1);
              }
              else {
                uVar37 = puVar25[1];
                *puVar24 = *puVar25;
                puVar24[1] = uVar37;
                if (0x10 < uVar48) {
                  pBVar39 = seqStore->lit;
                  puVar24 = (ulong *)(pBVar39 + 0x10);
                  puVar27 = puVar25 + 2;
                  if (0xffffffffffffffe8 < (ulong)((long)puVar24 + (-8 - (long)puVar27)))
                  goto LAB_0013f27b;
                  if (0xffffffffffffffe0 < (ulong)((long)puVar24 + (-0x10 - (long)puVar27)))
                  goto LAB_0013f29a;
                  uVar37 = puVar25[3];
                  *puVar24 = *puVar27;
                  *(ulong *)(pBVar39 + 0x18) = uVar37;
                  if (0x20 < (long)uVar48) {
                    lVar26 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                      uVar11 = puVar3[1];
                      pBVar2 = pBVar39 + lVar26 + 0x20;
                      *(undefined8 *)pBVar2 = *puVar3;
                      *(undefined8 *)(pBVar2 + 8) = uVar11;
                      puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                      uVar11 = puVar3[1];
                      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar11;
                      lVar26 = lVar26 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar39 + uVar48);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar48;
              if (0xffff < uVar48) {
                if (seqStore->longLengthID != 0) goto LAB_0013f25c;
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              uVar21 = UVar44 - (uVar31 + uVar21);
              psVar18 = seqStore->sequences;
              psVar18->litLength = (U16)uVar48;
              psVar18->offset = uVar21 + 3;
              if ((BYTE *)0xffff < pBVar43 + -3) {
                if (seqStore->longLengthID != 0) goto LAB_0013f21e;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar18->matchLength = (U16)(pBVar43 + -3);
              seqStore->sequences = psVar18 + 1;
              bVar12 = true;
              uVar45 = local_12c;
              local_12c = uVar21;
            }
            else {
              puVar30 = (ulong *)((long)puVar29 +
                                 ((long)puVar29 - (long)puVar25 >> 8) + (ulong)uVar15);
              bVar12 = false;
            }
            if (bVar12) goto LAB_0013ef93;
          }
        }
        else {
          puVar30 = iEnd;
          if (uVar33 < uVar4) {
            puVar30 = mEnd;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar29 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar30,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0013f1a2;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0013f1ff;
          puVar30 = (ulong *)((long)puVar29 + 1);
          uVar48 = (long)puVar30 - (long)puVar25;
          puVar24 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar24 + uVar48))
          goto LAB_0013f1c1;
          if (iEnd < puVar30) goto LAB_0013f1e0;
          if (puVar1 < puVar30) {
            ZSTD_safecopyLiterals((BYTE *)puVar24,(BYTE *)puVar25,(BYTE *)puVar30,(BYTE *)puVar1);
          }
          else {
            uVar37 = puVar25[1];
            *puVar24 = *puVar25;
            puVar24[1] = uVar37;
            if (0x10 < uVar48) {
              pBVar43 = seqStore->lit;
              puVar24 = (ulong *)(pBVar43 + 0x10);
              puVar27 = puVar25 + 2;
              if (0xffffffffffffffe8 < (ulong)((long)puVar24 + (-8 - (long)puVar27)))
              goto LAB_0013f27b;
              if (0xffffffffffffffe0 < (ulong)((long)puVar24 + (-0x10 - (long)puVar27)))
              goto LAB_0013f29a;
              uVar37 = puVar25[3];
              *puVar24 = *puVar27;
              *(ulong *)(pBVar43 + 0x18) = uVar37;
              if (0x20 < (long)uVar48) {
                lVar26 = 0;
                do {
                  puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x20);
                  uVar11 = puVar3[1];
                  pBVar39 = pBVar43 + lVar26 + 0x20;
                  *(undefined8 *)pBVar39 = *puVar3;
                  *(undefined8 *)(pBVar39 + 8) = uVar11;
                  puVar3 = (undefined8 *)((long)puVar25 + lVar26 + 0x30);
                  uVar11 = puVar3[1];
                  *(undefined8 *)(pBVar39 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar39 + 0x18) = uVar11;
                  lVar26 = lVar26 + 0x20;
                } while (pBVar39 + 0x20 < pBVar43 + uVar48);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar48;
          if (0xffff < uVar48) {
            if (seqStore->longLengthID != 0) goto LAB_0013f25c;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          pBVar43 = (BYTE *)(sVar16 + 4);
          pBVar39 = (BYTE *)(sVar16 + 1);
          psVar18 = *ppsVar17;
          psVar18->litLength = (U16)uVar48;
          psVar18->offset = 1;
          uVar21 = local_12c;
          if ((BYTE *)0xffff < pBVar39) {
            if (seqStore->longLengthID != 0) goto LAB_0013f21e;
LAB_0013eda3:
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
          }
LAB_0013edc1:
          psVar18->matchLength = (U16)pBVar39;
          *ppsVar17 = psVar18 + 1;
          local_12c = uVar21;
LAB_0013ef93:
          puVar30 = (ulong *)((long)puVar30 + (long)pBVar43);
          puVar25 = puVar30;
          if (puVar30 <= puVar22) {
            if (pBVar8 + ((long)puVar29 - (long)pBVar8 & 0xffffffffU) + 2 <= src) goto LAB_0013f23d;
            pUVar7[(uint)(*(int *)(pBVar8 + ((long)puVar29 - (long)pBVar8 & 0xffffffffU) + 2) *
                         -0x61c8864f) >> (bVar19 & 0x1f)] = UVar44 + 2;
            pUVar7[(uint)(*(int *)((long)puVar30 + -2) * -0x61c8864f) >> (bVar19 & 0x1f)] =
                 ((int)puVar30 + -2) - iVar46;
            do {
              puVar25 = puVar30;
              if (puVar22 < puVar30) break;
              UVar44 = (int)puVar30 - iVar46;
              uVar21 = UVar44 - uVar45;
              pBVar39 = pBVar8;
              if (uVar21 < uVar4) {
                pBVar39 = pBVar9 + -uVar34;
              }
              if (((uVar4 - 1) - uVar21 < 3) || (*(int *)(pBVar39 + uVar21) != (int)*puVar30)) {
                bVar12 = false;
                uVar21 = uVar45;
              }
              else {
                puVar25 = iEnd;
                if (uVar21 < uVar4) {
                  puVar25 = mEnd;
                }
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar30 + 4),
                                    (BYTE *)((long)(pBVar39 + uVar21) + 4),(BYTE *)iEnd,
                                    (BYTE *)puVar25,iStart);
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_0013f1a2;
                if (0x20000 < seqStore->maxNbLit) goto LAB_0013f1ff;
                puVar25 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar25) goto LAB_0013f1c1;
                if (iEnd < puVar30) goto LAB_0013f1e0;
                if (puVar1 < puVar30) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar25,(BYTE *)puVar30,(BYTE *)puVar30,(BYTE *)puVar1);
                }
                else {
                  uVar48 = puVar30[1];
                  *puVar25 = *puVar30;
                  puVar25[1] = uVar48;
                }
                psVar18 = seqStore->sequences;
                psVar18->litLength = 0;
                psVar18->offset = 1;
                if (0xffff < sVar16 + 1) {
                  if (seqStore->longLengthID != 0) goto LAB_0013f21e;
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar18->matchLength = (U16)(sVar16 + 1);
                seqStore->sequences = psVar18 + 1;
                pUVar7[(uint)((int)*puVar30 * -0x61c8864f) >> (bVar19 & 0x1f)] = UVar44;
                puVar30 = (ulong *)((long)puVar30 + sVar16 + 4);
                bVar12 = true;
                uVar21 = local_12c;
                local_12c = uVar45;
              }
              uVar45 = uVar21;
              puVar25 = puVar30;
            } while (bVar12);
          }
        }
        puVar29 = puVar30;
      } while (puVar30 < puVar22);
    }
  }
  *rep = local_12c;
  rep[1] = uVar45;
  return (long)iEnd - (long)puVar25;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}